

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool __thiscall absl::Mutex::TryLock(Mutex *this)

{
  ulong uVar1;
  ulong uVar2;
  GraphId GVar3;
  SynchLocksHeld *pSVar4;
  bool bVar5;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  uVar2 = uVar1;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    uVar2 = (this->mu_).super___atomic_base<long>._M_i;
    bVar5 = uVar1 == uVar2;
    if (bVar5) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
      uVar2 = uVar1;
    }
    UNLOCK();
    if (bVar5) {
      if (_ZN4absl12_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) {
        return true;
      }
      GVar3 = GetGraphId(this);
      pSVar4 = Synch_GetAllLocks();
      LockEnter(this,GVar3,pSVar4);
      return true;
    }
  }
  if ((uVar2 & 0x10) != 0) {
    if ((uVar2 & 9) == 0) {
      LOCK();
      bVar5 = uVar2 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar5) {
        (this->mu_).super___atomic_base<long>._M_i = uVar2 | 8;
      }
      UNLOCK();
      if (bVar5) {
        if (_ZN4absl12_GLOBAL__N_124synch_deadlock_detectionE_0 != 0) {
          GVar3 = GetGraphId(this);
          pSVar4 = Synch_GetAllLocks();
          LockEnter(this,GVar3,pSVar4);
        }
        PostSynchEvent(this,0);
        return true;
      }
    }
    PostSynchEvent(this,1);
  }
  return false;
}

Assistant:

bool Mutex::TryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & (kMuWriter | kMuReader | kMuEvent)) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(v, kMuWriter | v,
                                  std::memory_order_acquire,
                                  std::memory_order_relaxed)) {
    DebugOnlyLockEnter(this);
    ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
    return true;
  }
  if ((v & kMuEvent) != 0) {              // we're recording events
    if ((v & kExclusive->slow_need_zero) == 0 &&  // try fast acquire
        mu_.compare_exchange_strong(
            v, (kExclusive->fast_or | v) + kExclusive->fast_add,
            std::memory_order_acquire, std::memory_order_relaxed)) {
      DebugOnlyLockEnter(this);
      PostSynchEvent(this, SYNCH_EV_TRYLOCK_SUCCESS);
      ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
      return true;
    } else {
      PostSynchEvent(this, SYNCH_EV_TRYLOCK_FAILED);
    }
  }
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}